

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::select_variables(solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                   *this,int r_size,int bkmin,int bkmax)

{
  bool bVar1;
  int *piVar2;
  type prVar3;
  int local_28;
  int local_24;
  int i;
  int bkmax_local;
  int bkmin_local;
  int r_size_local;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  *this_local;
  
  local_24 = bkmax;
  i = bkmin;
  bkmax_local = r_size;
  _bkmin_local = this;
  if (bkmin == bkmax) {
    piVar2 = std::min<int>(&i,&bkmax_local);
    local_24 = *piVar2;
  }
  else {
    piVar2 = std::min<int>(&i,&bkmax_local);
    i = *piVar2;
    piVar2 = std::min<int>(&local_24,&bkmax_local);
    local_24 = *piVar2;
    for (local_28 = i; local_28 <= local_24; local_28 = local_28 + 1) {
      prVar3 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&this->R,(long)local_28);
      bVar1 = stop_iterating<baryonyx::itm::minimize_tag,long_double>(prVar3->value,this->rng);
      if (bVar1) {
        return local_28 + -1;
      }
    }
  }
  this_local._4_4_ = local_24 + -1;
  return this_local._4_4_;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }